

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O0

void m68k_op_cas2_16(void)

{
  uint address;
  uint address_00;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint *puVar5;
  uint *puVar6;
  uint local_44;
  uint local_40;
  uint res2;
  uint dest2;
  uint ea2;
  uint *compare2;
  uint res1;
  uint dest1;
  uint ea1;
  uint *compare1;
  uint word2;
  
  if ((m68ki_cpu.cpu_type & 0x3f8) == 0) {
    m68ki_exception_illegal();
  }
  else {
    uVar1 = m68ki_read_imm_32();
    puVar5 = m68ki_cpu.dar + (uVar1 >> 0x10 & 7);
    address = m68ki_cpu.dar[uVar1 >> 0x1c];
    uVar2 = m68ki_read_16_fc(address,m68ki_cpu.s_flag | m68ki_address_space);
    uVar3 = uVar2 - (*puVar5 & 0xffff);
    puVar6 = m68ki_cpu.dar + (uVar1 & 7);
    address_00 = m68ki_cpu.dar[uVar1 >> 0xc & 0xf];
    uVar4 = m68ki_read_16_fc(address_00,m68ki_cpu.s_flag | m68ki_address_space);
    m68ki_cpu.n_flag = uVar3 >> 8;
    m68ki_cpu.not_z_flag = uVar3 & 0xffff;
    m68ki_cpu.v_flag = ((*puVar5 ^ uVar2) & (uVar3 ^ uVar2)) >> 8;
    m68ki_cpu.c_flag = uVar3 >> 8;
    if (m68ki_cpu.not_z_flag == 0) {
      uVar3 = uVar4 - (*puVar6 & 0xffff);
      m68ki_cpu.n_flag = uVar3 >> 8;
      m68ki_cpu.not_z_flag = uVar3 & 0xffff;
      m68ki_cpu.v_flag = ((*puVar6 ^ uVar4) & (uVar3 ^ uVar4)) >> 8;
      m68ki_cpu.c_flag = uVar3 >> 8;
      if (m68ki_cpu.not_z_flag == 0) {
        m68ki_remaining_cycles = m68ki_remaining_cycles + -3;
        m68ki_write_16_fc(address,m68ki_cpu.s_flag | 1,m68ki_cpu.dar[uVar1 >> 0x16 & 7]);
        m68ki_write_16_fc(address_00,m68ki_cpu.s_flag | 1,m68ki_cpu.dar[uVar1 >> 6 & 7]);
        return;
      }
    }
    if ((uVar1 & 0x80000000) == 0) {
      local_40 = *puVar5 & 0xffff0000 | uVar2;
    }
    else {
      local_40 = (uint)(short)uVar2;
    }
    *puVar5 = local_40;
    if ((uVar1 & 0x8000) == 0) {
      local_44 = *puVar6 & 0xffff0000 | uVar4;
    }
    else {
      local_44 = (uint)(short)uVar4;
    }
    *puVar6 = local_44;
  }
  return;
}

Assistant:

static void m68k_op_cas2_16(void)
{
	if(CPU_TYPE_IS_EC020_PLUS(CPU_TYPE))
	{
		uint word2 = OPER_I_32();
		uint* compare1 = &REG_D[(word2 >> 16) & 7];
		uint ea1 = REG_DA[(word2 >> 28) & 15];
		uint dest1 = m68ki_read_16(ea1);
		uint res1 = dest1 - MASK_OUT_ABOVE_16(*compare1);
		uint* compare2 = &REG_D[word2 & 7];
		uint ea2 = REG_DA[(word2 >> 12) & 15];
		uint dest2 = m68ki_read_16(ea2);
		uint res2;

		m68ki_trace_t0();			   /* auto-disable (see m68kcpu.h) */
		FLAG_N = NFLAG_16(res1);
		FLAG_Z = MASK_OUT_ABOVE_16(res1);
		FLAG_V = VFLAG_SUB_16(*compare1, dest1, res1);
		FLAG_C = CFLAG_16(res1);

		if(COND_EQ())
		{
			res2 = dest2 - MASK_OUT_ABOVE_16(*compare2);

			FLAG_N = NFLAG_16(res2);
			FLAG_Z = MASK_OUT_ABOVE_16(res2);
			FLAG_V = VFLAG_SUB_16(*compare2, dest2, res2);
			FLAG_C = CFLAG_16(res2);

			if(COND_EQ())
			{
				USE_CYCLES(3);
				m68ki_write_16(ea1, REG_D[(word2 >> 22) & 7]);
				m68ki_write_16(ea2, REG_D[(word2 >> 6) & 7]);
				return;
			}
		}
        /*
        if (BIT_1F(word2)) {
            *compare1 = (uint)MAKE_INT_16(dest1);
        } else {
            *compare1 = MASK_OUT_BELOW_16(*compare1) | dest1;
        }
        if (BIT_F(word2)) {
            *compare2 = (uint)MAKE_INT_16(dest2);
        } else {
            *compare2 = MASK_OUT_BELOW_16(*compare2) | dest2;
        }
        */
        *compare1 = BIT_1F(word2) ? (uint)MAKE_INT_16(dest1) : MASK_OUT_BELOW_16(*compare1) | dest1;
		*compare2 = BIT_F(word2) ? (uint)MAKE_INT_16(dest2) : MASK_OUT_BELOW_16(*compare2) | dest2;
        return;
	}
	m68ki_exception_illegal();
}